

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
::write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
           *this,unsigned_long_long value)

{
  int iVar1;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar2;
  
  iVar1 = internal::count_digits(value);
  bVar2 = internal::
          format_decimal<char,unsigned_long,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,fmt::v5::internal::no_thousands_sep>
                    ((this->out_).container,value,iVar1);
  (this->out_).container = bVar2.container;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }